

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Float32_To_UInt8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  bool bVar1;
  float fVar2;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    fVar2 = PaUtil_GenerateFloatTriangularDither(ditherGenerator);
    *(char *)destinationBuffer = (char)(int)(*sourceBuffer * 126.0 + fVar2) + -0x80;
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
  }
  return;
}

Assistant:

static void Float32_To_UInt8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;

    while( count-- )
    {
        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (126.0f)) + dither;
        PaInt32 samp = (PaInt32) dithered;
        *dest = (unsigned char) (128 + samp);

        src += sourceStride;
        dest += destinationStride;
    }
}